

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.h
# Opt level: O2

void __thiscall leveldb::DBImpl::MaybeIgnoreError(DBImpl *this,Status *s)

{
  Logger *info_log;
  string local_38;
  
  if ((s->state_ != (char *)0x0) && ((this->options_).paranoid_checks == false)) {
    info_log = (this->options_).info_log;
    Status::ToString_abi_cxx11_(&local_38,s);
    Log(info_log,"Ignoring error %s",local_38._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
    local_38._M_dataplus._M_p = s->state_;
    s->state_ = (char *)0x0;
    Status::~Status((Status *)&local_38);
  }
  return;
}

Assistant:

bool ok() const { return (state_ == nullptr); }